

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O0

Dec_Graph_t * Abc_ManResubDivs3(Abc_ManRes_t *p,int Required)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Abc_Obj_t *p_00;
  Abc_Obj_t *p_01;
  Abc_Obj_t *pAVar9;
  Abc_Obj_t *p_02;
  Abc_Obj_t *pAVar10;
  Dec_Graph_t *pDVar11;
  uint local_78;
  int local_74;
  int Flag;
  int w;
  int k;
  int i;
  uint *puDataR;
  uint *puData3;
  uint *puData2;
  uint *puData1;
  uint *puData0;
  Abc_Obj_t *pObj3;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj1;
  Abc_Obj_t *pObj0;
  int Required_local;
  Abc_ManRes_t *p_local;
  
  local_74 = 0;
  pvVar1 = (p->pRoot->field_5).pData;
  w = 0;
  do {
    iVar6 = Vec_PtrSize(p->vDivs2UP0);
    if (iVar6 <= w) {
      return (Dec_Graph_t *)0x0;
    }
    p_00 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UP0,w);
    p_01 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UP1,w);
    pAVar9 = Abc_ObjRegular(p_00);
    pvVar2 = (pAVar9->field_5).pData;
    pAVar9 = Abc_ObjRegular(p_01);
    pvVar3 = (pAVar9->field_5).pData;
    iVar6 = Abc_ObjIsComplement(p_00);
    iVar7 = Abc_ObjIsComplement(p_01);
    local_78 = iVar6 << 3 | iVar7 << 2;
    Flag = w;
    while( true ) {
      Flag = Flag + 1;
      iVar6 = Vec_PtrSize(p->vDivs2UP0);
      if (iVar6 <= Flag) break;
      pAVar9 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UP0,Flag);
      p_02 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs2UP1,Flag);
      pAVar10 = Abc_ObjRegular(pAVar9);
      pvVar4 = (pAVar10->field_5).pData;
      pAVar10 = Abc_ObjRegular(p_02);
      pvVar5 = (pAVar10->field_5).pData;
      iVar6 = Abc_ObjIsComplement(pAVar9);
      uVar8 = Abc_ObjIsComplement(p_02);
      local_78 = local_78 & 0xc | iVar6 << 1 | uVar8;
      if (0xf < (int)local_78) {
        __assert_fail("Flag < 16",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x647,"Dec_Graph_t *Abc_ManResubDivs3(Abc_ManRes_t *, int)");
      }
      switch(local_78) {
      case 0:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 1:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  (*(uint *)((long)pvVar5 + (long)local_74 * 4) ^ 0xffffffff)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 2:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  (*(uint *)((long)pvVar4 + (long)local_74 * 4) ^ 0xffffffff) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 3:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 4:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   (*(uint *)((long)pvVar3 + (long)local_74 * 4) ^ 0xffffffff) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 5:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   (*(uint *)((long)pvVar3 + (long)local_74 * 4) ^ 0xffffffff) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  (*(uint *)((long)pvVar5 + (long)local_74 * 4) ^ 0xffffffff)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 6:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   (*(uint *)((long)pvVar3 + (long)local_74 * 4) ^ 0xffffffff) |
                  (*(uint *)((long)pvVar4 + (long)local_74 * 4) ^ 0xffffffff) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 7:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) &
                   (*(uint *)((long)pvVar3 + (long)local_74 * 4) ^ 0xffffffff) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 8:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               (((((*(uint *)((long)pvVar2 + (long)local_74 * 4) ^ 0xffffffff) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 9:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               (((((*(uint *)((long)pvVar2 + (long)local_74 * 4) ^ 0xffffffff) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  (*(uint *)((long)pvVar5 + (long)local_74 * 4) ^ 0xffffffff)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 10:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               (((((*(uint *)((long)pvVar2 + (long)local_74 * 4) ^ 0xffffffff) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  (*(uint *)((long)pvVar4 + (long)local_74 * 4) ^ 0xffffffff) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 0xb:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               (((((*(uint *)((long)pvVar2 + (long)local_74 * 4) ^ 0xffffffff) &
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 0xc:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) |
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 0xd:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) |
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) &
                  (*(uint *)((long)pvVar5 + (long)local_74 * 4) ^ 0xffffffff)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 0xe:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) |
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  (*(uint *)((long)pvVar4 + (long)local_74 * 4) ^ 0xffffffff) &
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
        break;
      case 0xf:
        local_74 = 0;
        while ((local_74 < p->nWords &&
               ((((*(uint *)((long)pvVar2 + (long)local_74 * 4) |
                   *(uint *)((long)pvVar3 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar4 + (long)local_74 * 4) |
                  *(uint *)((long)pvVar5 + (long)local_74 * 4)) ^
                 *(uint *)((long)pvVar1 + (long)local_74 * 4)) & p->pCareSet[local_74]) == 0))) {
          local_74 = local_74 + 1;
        }
      }
      if (local_74 == p->nWords) {
        p->nUsedNode3OrAnd = p->nUsedNode3OrAnd + 1;
        pDVar11 = Abc_ManResubQuit3(p->pRoot,p_00,p_01,pAVar9,p_02,1);
        return pDVar11;
      }
    }
    w = w + 1;
  } while( true );
}

Assistant:

Dec_Graph_t * Abc_ManResubDivs3( Abc_ManRes_t * p, int Required )
{
    Abc_Obj_t * pObj0, * pObj1, * pObj2, * pObj3;
    unsigned * puData0, * puData1, * puData2, * puData3, * puDataR;
    int i, k, w = 0, Flag;
    puDataR = (unsigned *)p->pRoot->pData;
    // check positive unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UP0, pObj0, i )
    {
        pObj1 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UP1, i );
        puData0 = (unsigned *)Abc_ObjRegular(pObj0)->pData;
        puData1 = (unsigned *)Abc_ObjRegular(pObj1)->pData;
        Flag = (Abc_ObjIsComplement(pObj0) << 3) | (Abc_ObjIsComplement(pObj1) << 2);

        Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDivs2UP0, pObj2, k, i + 1 )
        {
            pObj3 = (Abc_Obj_t *)Vec_PtrEntry( p->vDivs2UP1, k );
            puData2 = (unsigned *)Abc_ObjRegular(pObj2)->pData;
            puData3 = (unsigned *)Abc_ObjRegular(pObj3)->pData;

            Flag = (Flag & 12) | ((int)Abc_ObjIsComplement(pObj2) << 1) | (int)Abc_ObjIsComplement(pObj3);
            assert( Flag < 16 );
            switch( Flag )
            {
            case 0: // 0000
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & puData1[w]) | (puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & puData1[w]) | (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 1: // 0001
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & puData1[w]) | (puData2[w] & ~puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & puData1[w]) | (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 2: // 0010
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & puData1[w]) | (~puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & puData1[w]) | (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 3: // 0011
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & puData1[w]) | (puData2[w] | puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & puData1[w]) | (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;

            case 4: // 0100
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & ~puData1[w]) | (puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & ~puData1[w]) | (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 5: // 0101
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & ~puData1[w]) | (puData2[w] & ~puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & ~puData1[w]) | (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 6: // 0110
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & ~puData1[w]) | (~puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & ~puData1[w]) | (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 7: // 0111
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] & ~puData1[w]) | (puData2[w] | puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] & ~puData1[w]) | (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;

            case 8: // 1000
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((~puData0[w] & puData1[w]) | (puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((~puData0[w] & puData1[w]) | (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 9: // 1001
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((~puData0[w] & puData1[w]) | (puData2[w] & ~puData3[w])) != puDataR[w] )
                    if ( (((~puData0[w] & puData1[w]) | (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 10: // 1010
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((~puData0[w] & puData1[w]) | (~puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((~puData0[w] & puData1[w]) | (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 11: // 1011
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((~puData0[w] & puData1[w]) | (puData2[w] | puData3[w])) != puDataR[w] )
                    if ( (((~puData0[w] & puData1[w]) | (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;

            case 12: // 1100
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] | puData1[w]) | (puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] | puData1[w]) | (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] ) // care set
                        break;
                break;
            case 13: // 1101
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] | puData1[w]) | (puData2[w] & ~puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] | puData1[w]) | (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 14: // 1110
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] | puData1[w]) | (~puData2[w] & puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] | puData1[w]) | (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 15: // 1111
                for ( w = 0; w < p->nWords; w++ )
//                    if ( ((puData0[w] | puData1[w]) | (puData2[w] | puData3[w])) != puDataR[w] )
                    if ( (((puData0[w] | puData1[w]) | (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;

            }
            if ( w == p->nWords )
            {
                p->nUsedNode3OrAnd++;
                return Abc_ManResubQuit3( p->pRoot, pObj0, pObj1, pObj2, pObj3, 1 );
            }
        }
    }

/*
    // check negative unate divisors
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vDivs2UN0, pObj0, i )
    {
        pObj1 = Vec_PtrEntry( p->vDivs2UN1, i );
        puData0 = Abc_ObjRegular(pObj0)->pData;
        puData1 = Abc_ObjRegular(pObj1)->pData;
        Flag = (Abc_ObjIsComplement(pObj0) << 3) | (Abc_ObjIsComplement(pObj1) << 2);

        Vec_PtrForEachEntryStart( Abc_Obj_t *, p->vDivs2UN0, pObj2, k, i + 1 )
        {
            pObj3 = Vec_PtrEntry( p->vDivs2UN1, k );
            puData2 = Abc_ObjRegular(pObj2)->pData;
            puData3 = Abc_ObjRegular(pObj3)->pData;

            Flag = (Flag & 12) | (Abc_ObjIsComplement(pObj2) << 1) | Abc_ObjIsComplement(pObj3);
            assert( Flag < 16 );
            switch( Flag )
            {
            case 0: // 0000
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & puData1[w]) & (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 1: // 0001
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & puData1[w]) & (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 2: // 0010
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & puData1[w]) & (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 3: // 0011
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & puData1[w]) & (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;

            case 4: // 0100
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & ~puData1[w]) & (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 5: // 0101
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & ~puData1[w]) & (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 6: // 0110
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & ~puData1[w]) & (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 7: // 0111
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] & ~puData1[w]) & (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;

            case 8: // 1000
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((~puData0[w] & puData1[w]) & (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 9: // 1001
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((~puData0[w] & puData1[w]) & (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 10: // 1010
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((~puData0[w] & puData1[w]) & (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 11: // 1011
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((~puData0[w] & puData1[w]) & (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;

            case 12: // 1100
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] | puData1[w]) & (puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 13: // 1101
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] | puData1[w]) & (puData2[w] & ~puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 14: // 1110
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] | puData1[w]) & (~puData2[w] & puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;
            case 15: // 1111
                for ( w = 0; w < p->nWords; w++ )
                    if ( (((puData0[w] | puData1[w]) & (puData2[w] | puData3[w])) ^ puDataR[w]) & p->pCareSet[w] )
                        break;
                break;

            }
            if ( w == p->nWords )
            {
                p->nUsedNode3AndOr++;
                return Abc_ManResubQuit3( p->pRoot, pObj0, pObj1, pObj2, pObj3, 0 );
            }
        }
    }
*/
    return NULL;
}